

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int emptybuffer(luaL_Buffer *B)

{
  char *s;
  size_t len;
  
  s = B->buffer;
  len = (long)B->p - (long)s;
  if (len != 0) {
    lua_pushlstring(B->L,s,len);
    B->p = s;
    B->lvl = B->lvl + 1;
  }
  return (uint)(len != 0);
}

Assistant:

static int emptybuffer(luaL_Buffer*B){
size_t l=bufflen(B);
if(l==0)return 0;
else{
lua_pushlstring(B->L,B->buffer,l);
B->p=B->buffer;
B->lvl++;
return 1;
}
}